

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64Disassembler.c
# Opt level: O0

DecodeStatus DecodeSystemPStateInstruction(MCInst *Inst,uint32_t insn,uint64_t Addr,void *Decoder)

{
  uint Value;
  DecodeStatus DVar1;
  uint32_t in_ESI;
  MCInst *in_RDI;
  uint32_t pstate_field;
  _Bool ValidNamed;
  uint32_t crm;
  uint32_t op2;
  uint32_t op1;
  _Bool local_2d;
  uint local_2c;
  uint local_28;
  uint32_t local_24;
  uint32_t local_c;
  MCInst *local_8;
  
  local_c = in_ESI;
  local_8 = in_RDI;
  local_24 = fieldFromInstruction(in_ESI,0x10,3);
  local_28 = fieldFromInstruction(local_c,5,3);
  local_2c = fieldFromInstruction(local_c,8,4);
  Value = local_24 << 3 | local_28;
  MCOperand_CreateImm0(local_8,(ulong)Value);
  MCOperand_CreateImm0(local_8,(ulong)local_2c);
  A64NamedImmMapper_toString(&A64PState_PStateMapper,Value,&local_2d);
  DVar1 = MCDisassembler_Fail;
  if ((local_2d & 1U) != 0) {
    DVar1 = MCDisassembler_Success;
  }
  return DVar1;
}

Assistant:

static DecodeStatus DecodeSystemPStateInstruction(MCInst *Inst,
		uint32_t insn, uint64_t Addr,
		const void *Decoder)
{
	uint32_t op1 = fieldFromInstruction(insn, 16, 3);
	uint32_t op2 = fieldFromInstruction(insn, 5, 3);
	uint32_t crm = fieldFromInstruction(insn, 8, 4);
	bool ValidNamed;
	uint32_t pstate_field = (op1 << 3) | op2;

	MCOperand_CreateImm0(Inst, pstate_field);
	MCOperand_CreateImm0(Inst, crm);

	A64NamedImmMapper_toString(&A64PState_PStateMapper, pstate_field, &ValidNamed);

	return ValidNamed ? Success : Fail;
}